

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O1

void __thiscall PrintAST::visit(PrintAST *this,TokenNode *node)

{
  char *pcVar1;
  char *node_name;
  
  pcVar1 = (node->super_ExpNode).lexeme;
  node_name = token_id_to_name(node->token);
  if (pcVar1 != (char *)0x0) {
    printLexemeAST(this,node_name,(node->super_ExpNode).lexeme);
    return;
  }
  printAST(this,node_name);
  return;
}

Assistant:

void PrintAST::visit(TokenNode *node) {
    if (node->getLexeme() != nullptr) {
        this->printLexemeAST(token_id_to_name(node->getToken()), node->getLexeme());
    } else {
        this->printAST(token_id_to_name(node->getToken()));
    }
}